

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool nlohmann::json_abi_v3_11_2::operator==(const_reference lhs,const_reference rhs)

{
  value_t vVar1;
  value_t vVar2;
  pointer pbVar3;
  object_t *poVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  pointer pbVar9;
  pointer rhs_00;
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
  local_50;
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
  local_38;
  
  vVar1 = lhs->m_type;
  vVar2 = rhs->m_type;
  if (vVar1 != vVar2) {
    if (vVar1 == number_integer && (vVar2 ^ number_float) == null) {
      bVar6 = (double)(lhs->m_value).number_integer == (rhs->m_value).number_float;
      goto LAB_00148cbe;
    }
    if (vVar1 != number_float || (vVar2 ^ number_integer) != null) {
      if (vVar1 == number_unsigned && (vVar2 ^ number_float) == null) {
        bVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)(lhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(lhs->m_value).number_integer) -
                4503599627370496.0) == (rhs->m_value).number_float;
      }
      else {
        if (vVar1 != number_float || (vVar2 ^ number_unsigned) != null) {
          if ((vVar1 != number_unsigned || (vVar2 ^ number_integer) != null) &&
             (vVar1 != number_integer || (vVar2 ^ number_unsigned) != null)) {
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::compares_unordered(lhs,rhs,false);
            return false;
          }
          goto switchD_00148be2_caseD_5;
        }
        bVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)(rhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(rhs->m_value).number_integer) -
                4503599627370496.0) == (lhs->m_value).number_float;
      }
      goto LAB_00148cbe;
    }
    dVar5 = (double)(rhs->m_value).number_integer;
LAB_00148cb3:
    bVar6 = dVar5 == (lhs->m_value).number_float;
LAB_00148cbe:
    return (bool)(-bVar6 & 1);
  }
  bVar6 = true;
  bVar7 = true;
  switch(vVar1) {
  case null:
    goto switchD_00148be2_caseD_0;
  case object:
    poVar4 = (lhs->m_value).object;
    if ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar6 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                        ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          )&(poVar4->_M_t)._M_impl.super__Rb_tree_header,
                         (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left);
      return bVar6;
    }
    break;
  case array:
    pbVar9 = (((lhs->m_value).array)->
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (((lhs->m_value).array)->
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    rhs_00 = (((rhs->m_value).array)->
             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)pbVar3 - (long)pbVar9 ==
        (long)(((rhs->m_value).array)->
              super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
      while( true ) {
        if (pbVar9 == pbVar3) {
          return bVar6;
        }
        bVar6 = operator==(pbVar9,rhs_00);
        if (!bVar6) break;
        pbVar9 = pbVar9 + 1;
        rhs_00 = rhs_00 + 1;
      }
      return bVar6;
    }
    break;
  case string:
    pbVar9 = (pointer)((lhs->m_value).string)->_M_string_length;
    if (pbVar9 == (((rhs->m_value).array)->
                  super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      if (pbVar9 == (pointer)0x0) {
        return true;
      }
      iVar8 = bcmp((((lhs->m_value).string)->_M_dataplus)._M_p,
                   (((rhs->m_value).array)->
                   super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,(size_t)pbVar9);
      return iVar8 == 0;
    }
    break;
  case boolean:
    return (lhs->m_value).boolean == (rhs->m_value).boolean;
  case number_integer:
  case number_unsigned:
switchD_00148be2_caseD_5:
    return (lhs->m_value).object == (rhs->m_value).object;
  case number_float:
    dVar5 = (rhs->m_value).number_float;
    goto LAB_00148cb3;
  case binary:
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .
    super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
    ._M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lhs->m_value).object;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .
    super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
    ._M_head_impl = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(rhs->m_value).object;
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
         (unsigned_long *)
         &(((object_t *)
           local_38.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Tuple_impl<2UL,_const_bool_&>.super__Head_base<2UL,_const_bool_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_bool_&,_false>)
         &(((object_t *)
           local_38.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
         (unsigned_long *)
         &(((object_t *)
           local_50.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Tuple_impl<2UL,_const_bool_&>.super__Head_base<2UL,_const_bool_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_bool_&,_false>)
         &(((object_t *)
           local_50.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    bVar7 = std::
            __tuple_compare<std::tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>,_std::tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>,_0UL,_3UL>
            ::__eq(&local_38,&local_50);
    goto switchD_00148be2_caseD_0;
  }
  bVar7 = false;
switchD_00148be2_caseD_0:
  return bVar7;
}

Assistant:

constexpr value_t type() const noexcept
    {
        return m_type;
    }